

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O3

void __thiscall Wall::do_start(Wall *this,actor_ref *param_1,msg_start *msg)

{
  int iVar1;
  msg_t *in_RAX;
  pointer *__ptr;
  int iVar2;
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  acto::actor_ref::operator=(&this->m_console,&msg->console);
  if (0 < msg->balls) {
    iVar2 = 0;
    do {
      iVar1 = rand();
      if (this->m_players[iVar1 % 10000].object_ != (object_t *)0x0) {
        local_38._M_head_impl = (msg_t *)operator_new(0x20);
        ((local_38._M_head_impl)->super_node<acto::core::msg_t>).next = (msg_t *)0x0;
        ((local_38._M_head_impl)->type)._M_target = (type_info *)&msg_ball::typeinfo;
        (local_38._M_head_impl)->sender = (object_t *)0x0;
        (local_38._M_head_impl)->_vptr_msg_t = (_func_int **)&PTR__msg_t_0010e900;
        acto::actor_ref::send_message
                  (this->m_players + iVar1 % 10000,
                   (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
                   &local_38);
        if (local_38._M_head_impl != (msg_t *)0x0) {
          (*(local_38._M_head_impl)->_vptr_msg_t[1])();
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < msg->balls);
  }
  return;
}

Assistant:

void do_start(acto::actor_ref, const msg_start& msg) {
    m_console = msg.console;

    // Послать мячи в игру
    for (int i = 0; i < msg.balls; i++)
      m_players[ (rand() % PLAYERS) ].send(msg_ball());
  }